

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skippable_text.hpp
# Opt level: O1

void __thiscall
skippable_text<unsigned_int,_unsigned_int>::skippable_text
          (skippable_text<unsigned_int,_unsigned_int> *this,uint n)

{
  ulong *puVar1;
  pointer puVar2;
  pointer puVar3;
  ulong __n;
  uint uVar4;
  allocator_type local_49;
  undefined1 local_48 [16];
  pointer local_38;
  value_type_conflict2 local_28;
  
  this->BLANK = 0xffffffff;
  this->null = 0xffffffff;
  this->max_symbol = 0;
  (this->T).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->T).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->T).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->n = 0;
  this->non_blank_characters = 0;
  (this->non_blank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->non_blank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->non_blank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->skips).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->T).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)((long)&this->n + 1) = 0;
  *(undefined8 *)
   ((long)&(this->non_blank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + 1) = 0;
  *(undefined8 *)
   ((long)&(this->non_blank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->non_blank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)
   ((long)&(this->skips).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + 1) = 0;
  *(undefined8 *)
   ((long)&(this->skips).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->skips).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  this->n = n;
  this->non_blank_characters = n;
  uVar4 = n & 0x3f;
  __n = (ulong)((uint)(uVar4 != 0) + (n >> 6));
  local_28 = 0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,__n,&local_28,
             &local_49);
  (this->non_blank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_38;
  puVar2 = (this->non_blank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->non_blank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
  (this->non_blank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
  local_48 = ZEXT816(0) << 0x20;
  local_38 = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  if ((pointer)local_48._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_48._0_8_);
  }
  if (uVar4 != 0) {
    puVar1 = (this->non_blank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1;
    *puVar1 = *puVar1 & ~(0xffffffffffffffffU >> uVar4);
  }
  local_28 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,__n,&local_28,
             &local_49);
  (this->skips).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_38;
  puVar2 = (this->skips).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->skips).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
  (this->skips).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
  local_48 = ZEXT816(0) << 0x20;
  local_38 = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  if ((pointer)local_48._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_48._0_8_);
  }
  local_28 = local_28 & 0xffffffffffff0000;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_48,(ulong)n,
             (value_type_conflict3 *)&local_28,(allocator_type *)&local_49);
  (this->T).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_38;
  puVar3 = (this->T).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->T).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
  (this->T).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
  local_48 = ZEXT816(0) << 0x20;
  local_38 = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  if ((pointer)local_48._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_48._0_8_);
  }
  this->width = '\x10';
  return;
}

Assistant:

skippable_text(itype n){

		assert(n>0);

		this->n = n;
		non_blank_characters = n;

		non_blank = vector<uint64_t>(n/64+(n%64!=0),~uint64_t(0));//init all '1'

		if(n%64 != 0){//set to 0 bits in the right padding

			uint64_t MASK = ~((~uint64_t(0)) >> (n%64));
			non_blank[non_blank.size()-1] &= MASK;

		}

		//vector storing length of skips. Init with all 0
		skips = vector<uint64_t>(n/64+(n%64!=0),0);

		//T = int_vector<>(n, 0, width);
		T = vector<uint16_t>(n, 0); width = 16;

	}